

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3889::StatePointer_RegressionGitHubIssue4_Test::
~StatePointer_RegressionGitHubIssue4_Test(StatePointer_RegressionGitHubIssue4_Test *this)

{
  StatePointer_RegressionGitHubIssue4_Test *this_local;
  
  ~StatePointer_RegressionGitHubIssue4_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StatePointer, RegressionGitHubIssue4) {
	// Compile-time regression where apple-clang reported the following error:
	// 
	// [...]/state_ptr/include/putl/state_ptr.hpp:263:10: error: reinterpret_cast from rvalue to reference type
	//       'reference_type' (aka 'int &')
	//                 return reinterpret_cast<reference_type>(get_ptr());
	//                        ^~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
	// [...]/state_ptr/testsrc/state_ptr_tests.cpp:119:18: note: in instantiation of member function
	//       'putl::state_ptr<int, unsigned long, 2>::operator*' requested here
	//     int target = *underTest;
	int testData = 1;
	putl::state_ptr<int> underTest{&testData, 0};
	int target = *underTest;
	ASSERT_EQ(target, 1);
}